

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O2

void Diligent::
     FormatStrSS<std::__cxx11::stringstream,char[29],char_const*,char[15],char[21],unsigned_int,char[48],unsigned_int,char[18],char_const*,char[25]>
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss,
               char (*FirstArg) [29],char **RestArgs,char (*RestArgs_1) [15],char (*RestArgs_2) [21]
               ,uint *RestArgs_3,char (*RestArgs_4) [48],uint *RestArgs_5,char (*RestArgs_6) [18],
               char **RestArgs_7,char (*RestArgs_8) [25])

{
  std::operator<<((ostream *)(ss + 0x10),*FirstArg);
  FormatStrSS<std::__cxx11::stringstream,char_const*,char[15],char[21],unsigned_int,char[48],unsigned_int,char[18],char_const*,char[25]>
            (ss,RestArgs,RestArgs_1,RestArgs_2,RestArgs_3,RestArgs_4,RestArgs_5,RestArgs_6,
             RestArgs_7,RestArgs_8);
  return;
}

Assistant:

void FormatStrSS(SSType& ss, const FirstArgType& FirstArg, const RestArgsType&... RestArgs)
{
    FormatStrSS(ss, FirstArg);
    FormatStrSS(ss, RestArgs...); // recursive call using pack expansion syntax
}